

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O1

void __thiscall
helics::RandomDelayFilterOperation::setString
          (RandomDelayFilterOperation *this,string_view property,string_view val)

{
  long lVar1;
  int iVar2;
  TimeRepresentation<count_time<9,_long>_> TVar3;
  const_iterator cVar4;
  utilities *this_00;
  char *__s1;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *pcVar5;
  size_t __n;
  char *pcVar6;
  size_type __rlen;
  string_view timeString;
  string_view timeString_00;
  key_type local_40;
  
  pcVar6 = val._M_str;
  this_00 = (utilities *)val._M_len;
  __s1 = property._M_str;
  __n = property._M_len;
  lVar1 = __n - 3;
  local_40._M_len = (size_t)this_00;
  local_40._M_str = pcVar6;
  switch(lVar1) {
  case 0:
switchD_00226629_caseD_0:
    iVar2 = bcmp(__s1,"min",__n);
    pcVar5 = extraout_RDX;
    if (iVar2 == 0) goto LAB_00226843;
    switch(lVar1) {
    case 0:
      goto switchD_0022665d_caseD_0;
    case 1:
      goto switchD_0022665d_caseD_1;
    case 2:
      break;
    case 3:
      goto switchD_002266f9_caseD_3;
    default:
      goto switchD_00226629_caseD_4;
    }
  case 1:
    iVar2 = bcmp(__s1,"dist",__n);
    if (iVar2 != 0) {
      switch(lVar1) {
      case 0:
        goto switchD_00226629_caseD_0;
      case 1:
        goto switchD_002266c5_caseD_1;
      case 2:
        goto switchD_00226629_caseD_2;
      case 3:
        goto switchD_00226629_caseD_3;
      default:
        goto switchD_00226629_caseD_4;
      case 9:
        goto switchD_00226629_caseD_9;
      }
    }
    goto LAB_0022689b;
  case 2:
    break;
  case 3:
switchD_00226629_caseD_3:
    iVar2 = bcmp(__s1,"param1",__n);
    pcVar5 = extraout_RDX_00;
    if (iVar2 == 0) goto LAB_00226843;
    switch(lVar1) {
    case 0:
      goto switchD_00226629_caseD_0;
    case 1:
switchD_002266c5_caseD_1:
      iVar2 = bcmp(__s1,"mean",__n);
      pcVar5 = extraout_RDX_01;
      if (iVar2 == 0) goto LAB_00226843;
      switch(lVar1) {
      case 0:
        goto switchD_00226629_caseD_0;
      case 1:
        goto switchD_0022665d_caseD_1;
      case 2:
        break;
      case 3:
        goto switchD_002266f9_caseD_3;
      default:
        goto switchD_00226629_caseD_4;
      }
    case 2:
      break;
    case 3:
      goto switchD_002266f9_caseD_3;
    default:
      goto switchD_00226629_caseD_4;
    }
  default:
    goto switchD_00226629_caseD_4;
  case 9:
switchD_00226629_caseD_9:
    iVar2 = bcmp(__s1,"distribution",__n);
    if (iVar2 != 0) {
      switch(lVar1) {
      case 0:
        goto switchD_00226629_caseD_0;
      case 1:
        goto switchD_002266c5_caseD_1;
      case 2:
        goto switchD_00226629_caseD_2;
      case 3:
        goto switchD_00226629_caseD_3;
      default:
        goto switchD_00226629_caseD_4;
      }
    }
LAB_0022689b:
    cVar4 = std::
            _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::RandomDistributions>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::RandomDistributions>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::RandomDistributions>_>_>
            ::find((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::RandomDistributions>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::RandomDistributions>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::RandomDistributions>_>_>
                    *)distMap,&local_40);
    if (cVar4._M_node != (_Base_ptr)(distMap + 8)) {
      LOCK();
      (((this->rdelayGen)._M_t.
        super___uniq_ptr_impl<helics::RandomDelayGenerator,_std::default_delete<helics::RandomDelayGenerator>_>
        ._M_t.
        super__Tuple_impl<0UL,_helics::RandomDelayGenerator_*,_std::default_delete<helics::RandomDelayGenerator>_>
        .super__Head_base<0UL,_helics::RandomDelayGenerator_*,_false>._M_head_impl)->dist)._M_i =
           *(RandomDistributions *)&cVar4._M_node[1]._M_left;
      UNLOCK();
    }
    goto switchD_00226629_caseD_4;
  }
switchD_00226629_caseD_2:
  iVar2 = bcmp(__s1,"alpha",__n);
  pcVar5 = extraout_RDX_02;
  if (iVar2 == 0) {
LAB_00226843:
    timeString_00._M_str = pcVar5;
    timeString_00._M_len = (size_t)pcVar6;
    TVar3 = gmlc::utilities::loadTimeFromString<TimeRepresentation<count_time<9,long>>>
                      (this_00,timeString_00);
    LOCK();
    (((this->rdelayGen)._M_t.
      super___uniq_ptr_impl<helics::RandomDelayGenerator,_std::default_delete<helics::RandomDelayGenerator>_>
      ._M_t.
      super__Tuple_impl<0UL,_helics::RandomDelayGenerator_*,_std::default_delete<helics::RandomDelayGenerator>_>
      .super__Head_base<0UL,_helics::RandomDelayGenerator_*,_false>._M_head_impl)->param1).
    super___atomic_float<double>._M_fp =
         (double)(TVar3.internalTimeCode % 1000000000) * 1e-09 +
         (double)(TVar3.internalTimeCode / 1000000000);
    UNLOCK();
    return;
  }
  if (__n == 3) {
switchD_0022665d_caseD_0:
    iVar2 = bcmp(__s1,"max",__n);
    pcVar5 = extraout_RDX_05;
    if (iVar2 != 0) {
      if (__n != 4) {
        return;
      }
switchD_0022665d_caseD_1:
      iVar2 = bcmp(__s1,"beta",__n);
      pcVar5 = extraout_RDX_06;
      goto joined_r0x0022679f;
    }
  }
  else {
    if (__n == 4) goto switchD_0022665d_caseD_1;
    if (__n != 6) {
      return;
    }
switchD_002266f9_caseD_3:
    iVar2 = bcmp(__s1,"param2",__n);
    pcVar5 = extraout_RDX_03;
    if (iVar2 == 0) goto LAB_002267eb;
    if (__n == 3) goto switchD_0022665d_caseD_0;
    if (__n == 4) goto switchD_0022665d_caseD_1;
    if (__n != 6) {
      return;
    }
    iVar2 = bcmp(__s1,"stddev",6);
    pcVar5 = extraout_RDX_04;
joined_r0x0022679f:
    if (iVar2 != 0) {
      return;
    }
  }
LAB_002267eb:
  timeString._M_str = pcVar5;
  timeString._M_len = (size_t)pcVar6;
  TVar3 = gmlc::utilities::loadTimeFromString<TimeRepresentation<count_time<9,long>>>
                    (this_00,timeString);
  LOCK();
  (((this->rdelayGen)._M_t.
    super___uniq_ptr_impl<helics::RandomDelayGenerator,_std::default_delete<helics::RandomDelayGenerator>_>
    ._M_t.
    super__Tuple_impl<0UL,_helics::RandomDelayGenerator_*,_std::default_delete<helics::RandomDelayGenerator>_>
    .super__Head_base<0UL,_helics::RandomDelayGenerator_*,_false>._M_head_impl)->param2).
  super___atomic_float<double>._M_fp =
       (double)(TVar3.internalTimeCode % 1000000000) * 1e-09 +
       (double)(TVar3.internalTimeCode / 1000000000);
  UNLOCK();
switchD_00226629_caseD_4:
  return;
}

Assistant:

void RandomDelayFilterOperation::setString(std::string_view property, std::string_view val)
{
    if ((property == "dist") || (property == "distribution")) {
        auto res = distMap.find(val);
        if (res != distMap.end()) {
            rdelayGen->dist.store(res->second);
        }
    } else if ((property == "param1") || (property == "mean") || (property == "min") ||
               (property == "alpha")) {
        auto time = gmlc::utilities::loadTimeFromString<helics::Time>(val);
        rdelayGen->param1.store(static_cast<double>(time));
    } else if ((property == "param2") || (property == "stddev") || (property == "max") ||
               (property == "beta")) {
        auto time = gmlc::utilities::loadTimeFromString<helics::Time>(val);
        rdelayGen->param2.store(static_cast<double>(time));
    }
}